

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaParseIncludeOrRedefine
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,int type)

{
  byte *pbVar1;
  _xmlAttr *p_Var2;
  bool bVar3;
  bool bVar4;
  xmlSchemaPtr schema_00;
  int iVar5;
  int iVar6;
  xmlAttrPtr ownerItem;
  xmlSchemaTypePtr attr;
  xmlChar *pxVar7;
  xmlChar *name;
  undefined4 in_register_0000000c;
  xmlNodePtr ownerElem;
  xmlNodePtr extraout_RDX;
  xmlNodePtr pxVar8;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr extraout_RDX_01;
  xmlNodePtr extraout_RDX_02;
  xmlParserErrors xVar9;
  xmlChar **in_R8;
  char *pcVar10;
  char *in_R9;
  _xmlAttr **pp_Var11;
  _xmlNode *ownerElem_00;
  xmlChar *local_50;
  int local_44;
  xmlSchemaBucketPtr_conflict bucket;
  xmlSchemaPtr local_38;
  
  ownerElem = (xmlNodePtr)CONCAT44(in_register_0000000c,type);
  bucket = (xmlSchemaBucketPtr_conflict)0x0;
  local_50 = (xmlChar *)0x0;
  pp_Var11 = &node->properties;
  pxVar8 = node;
  local_44 = type;
  local_38 = schema;
  while (p_Var2 = *pp_Var11, p_Var2 != (_xmlAttr *)0x0) {
    if (p_Var2->ns == (xmlNs *)0x0) {
      iVar5 = xmlStrEqual(p_Var2->name,"id");
      pxVar8 = extraout_RDX_01;
      if ((iVar5 == 0) &&
         (iVar5 = xmlStrEqual(p_Var2->name,"schemaLocation"), pxVar8 = extraout_RDX_02, iVar5 == 0))
      goto LAB_001af7c2;
    }
    else {
      iVar5 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar8 = extraout_RDX;
      if (iVar5 != 0) {
LAB_001af7c2:
        xmlSchemaPIllegalAttrErr
                  (pctxt,(xmlParserErrors)p_Var2,(xmlSchemaBasicItemPtr)pxVar8,(xmlAttrPtr)ownerElem
                  );
        pxVar8 = extraout_RDX_00;
      }
    }
    pp_Var11 = &p_Var2->next;
  }
  xmlSchemaPValAttrID(pctxt,node,(xmlChar *)pxVar8);
  ownerItem = xmlSchemaGetPropNode(node,"schemaLocation");
  if (ownerItem == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (pctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1ef78b,ownerElem,(char *)in_R8,
               in_R9);
LAB_001af881:
    if (pctxt->err != 0) {
      return pctxt->err;
    }
  }
  else {
    attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
    iVar5 = xmlSchemaPValAttrNode
                      (pctxt,(xmlSchemaBasicItemPtr)ownerItem,(xmlAttrPtr)attr,
                       (xmlSchemaTypePtr)&local_50,in_R8);
    if (iVar5 != 0) goto LAB_001af881;
    pxVar7 = xmlNodeGetBase(node->doc,node);
    if (pxVar7 == (xmlChar *)0x0) {
      name = xmlBuildURI(local_50,node->doc->URL);
    }
    else {
      name = xmlBuildURI(local_50,pxVar7);
      (*xmlFree)(pxVar7);
    }
    if (name == (xmlChar *)0x0) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseIncludeOrRedefine",
                 "could not build an URI from the schemaLocation");
      return -1;
    }
    local_50 = xmlDictLookup(pctxt->dict,name,-1);
    (*xmlFree)(name);
    iVar5 = xmlStrEqual(local_50,pctxt->URL);
    if (iVar5 != 0) {
      if (local_44 == 3) {
        pcVar10 = "The schema document \'%s\' cannot redefine itself.";
        xVar9 = XML_SCHEMAP_SRC_REDEFINE;
      }
      else {
        pcVar10 = "The schema document \'%s\' cannot include itself.";
        xVar9 = XML_SCHEMAP_SRC_INCLUDE;
      }
      xmlSchemaPCustomErr(pctxt,xVar9,(xmlSchemaBasicItemPtr)0x0,node,pcVar10,local_50);
      goto LAB_001af881;
    }
  }
  pxVar8 = node;
  iVar5 = xmlSchemaAddSchemaDoc
                    (pctxt,local_44,local_50,(xmlDocPtr)0x0,(char *)0x0,0,node,
                     pctxt->targetNamespace,(xmlChar *)0x0,&bucket);
  if (iVar5 != 0) {
    return iVar5;
  }
  if ((bucket == (xmlSchemaBucketPtr_conflict)0x0) || (bucket->doc == (xmlDocPtr)0x0)) {
    if (local_44 == 2) {
      pcVar10 = "Failed to load the document \'%s\' for inclusion";
      iVar5 = 0xbea;
      xVar9 = XML_SCHEMAP_SRC_INCLUDE;
    }
    else {
      pcVar10 = "Failed to load the document \'%s\' for redefinition";
      iVar5 = 0xc09;
      xVar9 = XML_SCHEMAP_SRC_REDEFINE;
    }
    pxVar8 = (xmlNodePtr)0x0;
    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,xVar9,node,(xmlSchemaBasicItemPtr)0x0,pcVar10
                       ,local_50,(xmlChar *)0x0);
    bVar3 = true;
  }
  else {
    pxVar7 = pctxt->targetNamespace;
    if (bucket->origTargetNamespace == (xmlChar *)0x0) {
      if (pxVar7 != (xmlChar *)0x0) {
        bucket->targetNamespace = pxVar7;
        iVar5 = 0;
        bVar3 = false;
        goto LAB_001afa48;
      }
    }
    else {
      if (pxVar7 == (xmlChar *)0x0) {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_INCLUDE,node,
                           (xmlSchemaBasicItemPtr)0x0,
                           "The target namespace of the included/redefined schema \'%s\' has to be absent, since the including/redefining schema has no target namespace"
                           ,local_50,(xmlChar *)0x0);
LAB_001afde3:
        return pctxt->err;
      }
      iVar5 = xmlStrEqual(bucket->origTargetNamespace,pxVar7);
      if (iVar5 == 0) {
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_SRC_INCLUDE,(xmlSchemaBasicItemPtr)0x0,node,
                   "The target namespace \'%s\' of the included/redefined schema \'%s\' differs from \'%s\' of the including/redefining schema"
                   ,bucket->origTargetNamespace,local_50,pctxt->targetNamespace);
        goto LAB_001afde3;
      }
    }
    bVar3 = true;
    iVar5 = 0;
  }
LAB_001afa48:
  if (((bucket != (xmlSchemaBucketPtr_conflict)0x0) && (bucket->parsed == 0)) &&
     (bucket->doc != (xmlDocPtr)0x0)) {
    if (bVar3) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (((uint)local_38->flags >> 9 & 1) == 0) {
        local_38->flags = local_38->flags | 0x200;
        bVar4 = false;
      }
    }
    xmlSchemaParseNewDoc(pctxt,local_38,bucket);
    if (!bVar3 && !bVar4) {
      pbVar1 = (byte *)((long)&local_38->flags + 1);
      *pbVar1 = *pbVar1 ^ 2;
    }
  }
  schema_00 = local_38;
  ownerElem_00 = node->children;
  if (local_44 == 3) {
    pctxt->redefined = bucket;
    pctxt->isRedefine = 1;
    for (; ownerElem_00 != (xmlNodePtr)0x0; ownerElem_00 = ownerElem_00->next) {
      if ((ownerElem_00->ns == (xmlNs *)0x0) ||
         (((iVar6 = xmlStrEqual(ownerElem_00->name,"annotation"), iVar6 == 0 ||
           (iVar6 = xmlStrEqual(ownerElem_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                               ), iVar6 == 0)) &&
          ((ownerElem_00->ns == (xmlNs *)0x0 ||
           (((iVar6 = xmlStrEqual(ownerElem_00->name,"simpleType"), iVar6 == 0 ||
             (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) &&
            ((ownerElem_00->ns == (xmlNs *)0x0 ||
             (((iVar6 = xmlStrEqual(ownerElem_00->name,(xmlChar *)"complexType"), iVar6 == 0 ||
               (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) &&
              ((ownerElem_00->ns == (xmlNs *)0x0 ||
               (((iVar6 = xmlStrEqual(ownerElem_00->name,"group"), iVar6 == 0 ||
                 (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                && ((ownerElem_00->ns == (xmlNs *)0x0 ||
                    ((iVar6 = xmlStrEqual(ownerElem_00->name,(xmlChar *)"attributeGroup"),
                     iVar6 == 0 ||
                     (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0
                     )))))))))))))))))))) {
        pctxt->redefined = (xmlSchemaBucketPtr_conflict)0x0;
        pctxt->isRedefine = 0;
        pcVar10 = "(annotation | (simpleType | complexType | group | attributeGroup))*";
        goto LAB_001afd58;
      }
      if ((ownerElem_00->ns != (xmlNs *)0x0) &&
         (((iVar6 = xmlStrEqual(ownerElem_00->name,"annotation"), iVar6 == 0 ||
           (iVar6 = xmlStrEqual(ownerElem_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                               ), iVar6 == 0)) && (ownerElem_00->ns != (xmlNs *)0x0)))) {
        iVar6 = xmlStrEqual(ownerElem_00->name,"simpleType");
        if ((iVar6 == 0) ||
           (iVar6 = xmlStrEqual(ownerElem_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                               ), iVar6 == 0)) {
          if (ownerElem_00->ns != (xmlNs *)0x0) {
            iVar6 = xmlStrEqual(ownerElem_00->name,(xmlChar *)"complexType");
            if ((iVar6 == 0) ||
               (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) {
              if (ownerElem_00->ns != (xmlNs *)0x0) {
                iVar6 = xmlStrEqual(ownerElem_00->name,"group");
                if ((iVar6 == 0) ||
                   (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                {
                  if ((ownerElem_00->ns != (xmlNs *)0x0) &&
                     ((iVar6 = xmlStrEqual(ownerElem_00->name,(xmlChar *)"attributeGroup"),
                      iVar6 != 0 &&
                      (iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar6 != 0)))) {
                    xmlSchemaParseAttributeGroupDefinition(pctxt,schema_00,ownerElem_00);
                  }
                }
                else {
                  xmlSchemaParseModelGroupDefinition(pctxt,schema_00,ownerElem_00);
                }
              }
            }
            else {
              xmlSchemaParseComplexType(pctxt,schema_00,ownerElem_00,1);
            }
          }
        }
        else {
          xmlSchemaParseSimpleType(pctxt,schema_00,ownerElem_00,1);
        }
      }
    }
    pctxt->redefined = (xmlSchemaBucketPtr_conflict)0x0;
    pctxt->isRedefine = 0;
  }
  else if ((ownerElem_00 != (_xmlNode *)0x0) &&
          (((ownerElem_00->ns == (xmlNs *)0x0 ||
            (iVar6 = xmlStrEqual(ownerElem_00->name,"annotation"), iVar6 == 0)) ||
           ((iVar6 = xmlStrEqual(ownerElem_00->ns->href,
                                 (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0 ||
            (ownerElem_00 = ownerElem_00->next, ownerElem_00 != (_xmlNode *)0x0)))))) {
    pcVar10 = "(annotation?)";
LAB_001afd58:
    iVar5 = 0xbd9;
    xmlSchemaPContentErr
              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,ownerElem_00,
               (xmlNodePtr)0x0,pcVar10,(char *)pxVar8);
  }
  return iVar5;
}

Assistant:

static int
xmlSchemaParseIncludeOrRedefine(xmlSchemaParserCtxtPtr pctxt,
				xmlSchemaPtr schema,
				xmlNodePtr node,
				int type)
{
    xmlNodePtr child = NULL;
    const xmlChar *schemaLocation = NULL;
    int res = 0; /* hasRedefinitions = 0 */
    int isChameleon = 0, wasChameleon = 0;
    xmlSchemaBucketPtr bucket = NULL;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (-1);

    /*
    * Parse attributes. Note that the returned schemaLocation will
    * be already converted to an absolute URI.
    */
    res = xmlSchemaParseIncludeOrRedefineAttrs(pctxt, schema,
	node, (xmlChar **) (&schemaLocation), type);
    if (res != 0)
	return(res);
    /*
    * Load and add the schema document.
    */
    res = xmlSchemaAddSchemaDoc(pctxt, type, schemaLocation, NULL,
	NULL, 0, node, pctxt->targetNamespace, NULL, &bucket);
    if (res != 0)
	return(res);
    /*
    * If we get no schema bucket back, then this means that the schema
    * document could not be located or was broken XML or was not
    * a schema document.
    */
    if ((bucket == NULL) || (bucket->doc == NULL)) {
	if (type == XML_SCHEMA_SCHEMA_INCLUDE) {
	    /*
	    * WARNING for <include>:
	    * We will raise an error if the schema cannot be located
	    * for inclusions, since the that was the feedback from the
	    * schema people. I.e. the following spec piece will *not* be
	    * satisfied:
	    * SPEC src-include: "It is not an error for the `actual value` of the
	    * schemaLocation [attribute] to fail to resolve it all, in which
	    * case no corresponding inclusion is performed.
	    * So do we need a warning report here?"
	    */
	    res = XML_SCHEMAP_SRC_INCLUDE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for inclusion",
		schemaLocation, NULL);
	} else {
	    /*
	    * NOTE: This was changed to raise an error even if no redefinitions
	    * are specified.
	    *
	    * SPEC src-redefine (1)
	    * "If there are any element information items among the [children]
	    * other than <annotation> then the `actual value` of the
	    * schemaLocation [attribute] must successfully resolve."
	    * TODO: Ask the WG if a the location has always to resolve
	    * here as well!
	    */
	    res = XML_SCHEMAP_SRC_REDEFINE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for redefinition",
		schemaLocation, NULL);
	}
    } else {
	/*
	* Check targetNamespace sanity before parsing the new schema.
	* TODO: Note that we won't check further content if the
	* targetNamespace was bad.
	*/
	if (bucket->origTargetNamespace != NULL) {
	    /*
	    * SPEC src-include (2.1)
	    * "SII has a targetNamespace [attribute], and its `actual
	    * value` is identical to the `actual value` of the targetNamespace
	    * [attribute] of SII' (which must have such an [attribute])."
	    */
	    if (pctxt->targetNamespace == NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent, since the including/redefining "
		    "schema has no target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    } else if (!xmlStrEqual(bucket->origTargetNamespace,
		pctxt->targetNamespace)) {
		/* TODO: Change error function. */
		xmlSchemaPCustomErrExt(pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    NULL, node,
		    "The target namespace '%s' of the included/redefined "
		    "schema '%s' differs from '%s' of the "
		    "including/redefining schema",
		    bucket->origTargetNamespace, schemaLocation,
		    pctxt->targetNamespace);
		goto exit_error;
	    }
	} else if (pctxt->targetNamespace != NULL) {
	    /*
	    * Chameleons: the original target namespace will
	    * differ from the resulting namespace.
	    */
	    isChameleon = 1;
	    if (bucket->parsed &&
		bucket->origTargetNamespace != NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent or the same as the "
		    "including/redefining schema's target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    }
	    bucket->targetNamespace = pctxt->targetNamespace;
	}
    }
    /*
    * Parse the schema.
    */
    if (bucket && (!bucket->parsed) && (bucket->doc != NULL)) {
	if (isChameleon) {
	    /* TODO: Get rid of this flag on the schema itself. */
	    if ((schema->flags & XML_SCHEMAS_INCLUDING_CONVERT_NS) == 0) {
		schema->flags |= XML_SCHEMAS_INCLUDING_CONVERT_NS;
	    } else
		wasChameleon = 1;
	}
	xmlSchemaParseNewDoc(pctxt, schema, bucket);
	/* Restore chameleon flag. */
	if (isChameleon && (!wasChameleon))
	    schema->flags ^= XML_SCHEMAS_INCLUDING_CONVERT_NS;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	/*
	* Parse (simpleType | complexType | group | attributeGroup))*
	*/
	pctxt->redefined = bucket;
	/*
	* How to proceed if the redefined schema was not located?
	*/
	pctxt->isRedefine = 1;
	while (IS_SCHEMA(child, "annotation") ||
	    IS_SCHEMA(child, "simpleType") ||
	    IS_SCHEMA(child, "complexType") ||
	    IS_SCHEMA(child, "group") ||
	    IS_SCHEMA(child, "attributeGroup")) {
	    if (IS_SCHEMA(child, "annotation")) {
		/*
		* TODO: discard or not?
		*/
	    } else if (IS_SCHEMA(child, "simpleType")) {
		xmlSchemaParseSimpleType(pctxt, schema, child, 1);
	    } else if (IS_SCHEMA(child, "complexType")) {
		xmlSchemaParseComplexType(pctxt, schema, child, 1);
		/* hasRedefinitions = 1; */
	    } else if (IS_SCHEMA(child, "group")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseModelGroupDefinition(pctxt,
		    schema, child);
	    } else if (IS_SCHEMA(child, "attributeGroup")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseAttributeGroupDefinition(pctxt, schema,
		    child);
	    }
	    child = child->next;
	}
	pctxt->redefined = NULL;
	pctxt->isRedefine = 0;
    } else {
	if (IS_SCHEMA(child, "annotation")) {
	    /*
	    * TODO: discard or not?
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	res = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
	if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	    xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation | (simpleType | complexType | group | attributeGroup))*");
	} else {
	     xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation?)");
	}
    }
    return(res);

exit_error:
    return(pctxt->err);
}